

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O1

Function * LLVMBC::dyn_cast<LLVMBC::Function>(Value *value)

{
  ValueKind VVar1;
  Function *pFVar2;
  LoggingCallback p_Var3;
  void *pvVar4;
  char acStack_1018 [4104];
  
  if (value == (Value *)0x0) {
    pFVar2 = (Function *)0x0;
  }
  else {
    do {
      VVar1 = Value::get_value_kind(value);
      if (VVar1 != Proxy) break;
      VVar1 = Value::get_value_kind(value);
      if (VVar1 != Proxy) {
        p_Var3 = ::dxil_spv::get_thread_log_callback();
        if (p_Var3 != (LoggingCallback)0x0) {
          builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
          builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
          pvVar4 = ::dxil_spv::get_thread_log_callback_userdata();
          (*p_Var3)(pvVar4,Error,acStack_1018);
          std::terminate();
        }
        dyn_cast<LLVMBC::Function>();
        std::terminate();
      }
      value = (Value *)(((Function *)value)->super_Constant).apfloat.type;
    } while ((Function *)value != (Function *)0x0);
    VVar1 = Value::get_value_kind(value);
    pFVar2 = (Function *)0x0;
    if (VVar1 == Function) {
      pFVar2 = (Function *)value;
    }
  }
  return pFVar2;
}

Assistant:

inline T *dyn_cast(Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<T *>(value);
	else
		return nullptr;
}